

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O0

alns_t * example::filter_to_unique_cds_for_gene
                   (alns_t *__return_storage_ptr__,alns_t *alns_for_gene)

{
  sort_by<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:275:17),_rangeless::fn::impl::stable_sort_tag>
  local_ae [3];
  anon_class_1_1_5d8233e6 local_ab [2];
  concat local_a9 [3];
  anon_class_1_1_5d8233e6 local_a6 [18];
  anon_class_1_1_5d8233e6 local_94 [3];
  where<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:252:15)>
  local_91;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_90;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_78;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_60;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_48;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_30;
  alns_t *local_18;
  alns_t *alns_for_gene_local;
  
  local_18 = alns_for_gene;
  alns_for_gene_local = __return_storage_ptr__;
  rangeless::fn::
  where<example::filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::__3>
            ();
  rangeless::fn::operators::operator%(&local_90,alns_for_gene,&local_91);
  my::$_0::operator()((__0 *)&my::group_all_by);
  rangeless::fn::operators::operator()(&local_78,&local_90,local_94);
  my::$_4::operator()((__4 *)&my::where_max_by);
  rangeless::fn::operators::operator()(&local_60,&local_78,local_a6);
  rangeless::fn::concat();
  rangeless::fn::operators::operator%(&local_48,&local_60,local_a9);
  my::$_2::operator()((__2 *)&my::where_min_by);
  rangeless::fn::operators::operator()(&local_30,&local_48,local_ab);
  rangeless::fn::
  sort_by<example::filter_to_unique_cds_for_gene(std::vector<example::aln_t,std::allocator<example::aln_t>>)::__4>
            ();
  rangeless::fn::operators::operator%(__return_storage_ptr__,&local_30,local_ae);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_30);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_48);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_78);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_90);
  return __return_storage_ptr__;
}

Assistant:

static auto filter_to_unique_cds_for_gene(alns_t alns_for_gene) -> alns_t
{
    return std::move(alns_for_gene)

    // (5.1) Keep alignments with valid cds-start.

  % fn::where L( _.chr_cds_start_pos != aln_t::invalid_pos )

    //-------------------------------------------------------------------
    // (5.2) Keep alignments with most-ubiquitous valid cds-starts.

  % my::group_all_by L( _.chr_cds_start_pos )
  % my::where_max_by L( _.size() )
  % fn::concat()

    //-------------------------------------------------------------------
    // Filter to unique chr_cds_start_pos.
    // (5.3) Prefer on "NC_*" chr-accession,
    // (5.4) then lower chr-id, 
    // (5.5) then more upstream cds-start.

  % my::where_min_by L( fn::tie_lvals( _.chr_id.first.find("NC_") != 0, 
                                       _.chr_id, 
                                       _.chr_cds_start_pos))

#if 1
    //-------------------------------------------------------------------
    // (6) Sort by decreasing alignment score, then by increasing mrna-id.

  % fn::sort_by L( fn::tie_lvals( fn::by::decreasing( _.score), _.mrna_id))

#else // alternatively, e.g if you want to use your own sort

  % [](alns_t alns)
    {
        gfx::timsort(
            alns.begin(), alns.end(), 
            fn::by::make_comp([](const aln_t& a)
            {
                return std::make_pair(
                   fn::by::decreasing( a.score),
                            std::cref( a.mrna_id));
            });
        return std::move(alns);
    }
#endif
    ; // end of return-statement
}